

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

void __thiscall duckdb::PipelineExecutor::InitializeChunk(PipelineExecutor *this,DataChunk *chunk)

{
  Pipeline *pPVar1;
  PhysicalOperator *pPVar2;
  optional_ptr<duckdb::PhysicalOperator,_true> *this_00;
  Allocator *allocator;
  
  pPVar1 = this->pipeline;
  if ((pPVar1->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pPVar1->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &pPVar1->source;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
  }
  else {
    this_00 = (optional_ptr<duckdb::PhysicalOperator,_true> *)
              vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::back
                        (&pPVar1->operators);
  }
  pPVar2 = this_00->ptr;
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(chunk,allocator,&pPVar2->types,0x800);
  return;
}

Assistant:

void PipelineExecutor::InitializeChunk(DataChunk &chunk) {
	auto &last_op = pipeline.operators.empty() ? *pipeline.source : pipeline.operators.back().get();
	chunk.Initialize(Allocator::DefaultAllocator(), last_op.GetTypes());
}